

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O3

void __thiscall QKeySequenceEdit::QKeySequenceEdit(QKeySequenceEdit *this,QWidget *parent)

{
  QWidgetPrivate *this_00;
  
  this_00 = (QWidgetPrivate *)operator_new(0x2a0);
  QWidgetPrivate::QWidgetPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QKeySequenceEditPrivate_007f3978;
  QKeySequence::QKeySequence((QKeySequence *)&this_00[1].field_0x8);
  *(undefined4 *)&this_00[1].field_0x14 = 4;
  *(undefined8 *)&this_00[1].field_0x18 = 0x1ffffff01ffffff;
  *(undefined8 *)&this_00[1].field_0x20 = 0x1ffffff01ffffff;
  *(undefined8 *)&this_00[1].field_0x2c = 0;
  *(undefined8 *)&this_00[1].field_0x34 = 0;
  *(undefined8 *)&this_00[1].field_0x38 = 0;
  *(undefined8 *)&this_00[1].field_0x40 = 0;
  QWidget::QWidget((QWidget *)this,this_00,parent,(WindowFlags)0x0);
  *(undefined ***)this = &PTR_metaObject_007f36c0;
  *(undefined ***)(this + 0x10) = &PTR__QKeySequenceEdit_007f3870;
  QKeySequenceEditPrivate::init(*(QKeySequenceEditPrivate **)(this + 8),(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QKeySequenceEdit::QKeySequenceEdit(QWidget *parent)
    : QKeySequenceEdit(*new QKeySequenceEditPrivate, parent, { })
{
}